

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Corruption::_Run(_Test_Corruption *this)

{
  char *d;
  size_t sVar1;
  Slice SVar2;
  leveldb local_250 [32];
  Tester local_230;
  Slice local_90;
  undefined1 local_80 [8];
  Slice contents;
  Slice local_60 [2];
  Slice local_40;
  undefined1 local_30 [8];
  WriteBatch batch;
  _Test_Corruption *this_local;
  
  batch._24_8_ = this;
  WriteBatch::WriteBatch((WriteBatch *)local_30);
  Slice::Slice(&local_40,"foo");
  Slice::Slice(local_60,"bar");
  WriteBatch::Put((WriteBatch *)local_30,&local_40,local_60);
  Slice::Slice((Slice *)&contents.size_,"box");
  WriteBatch::Delete((WriteBatch *)local_30,(Slice *)&contents.size_);
  WriteBatchInternal::SetSequence((WriteBatch *)local_30,200);
  SVar2 = WriteBatchInternal::Contents((WriteBatch *)local_30);
  contents.data_ = (char *)SVar2.size_;
  local_80 = (undefined1  [8])SVar2.data_;
  d = Slice::data((Slice *)local_80);
  sVar1 = Slice::size((Slice *)local_80);
  Slice::Slice(&local_90,d,sVar1 - 1);
  WriteBatchInternal::SetContents((WriteBatch *)local_30,&local_90);
  test::Tester::Tester
            (&local_230,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x59);
  PrintContents_abi_cxx11_(local_250,(WriteBatch *)local_30);
  test::Tester::IsEq<char[30],std::__cxx11::string>
            (&local_230,(char (*) [30])"Put(foo, bar)@200ParseError()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  std::__cxx11::string::~string((string *)local_250);
  test::Tester::~Tester(&local_230);
  WriteBatch::~WriteBatch((WriteBatch *)local_30);
  return;
}

Assistant:

TEST(WriteBatchTest, Corruption) {
  WriteBatch batch;
  batch.Put(Slice("foo"), Slice("bar"));
  batch.Delete(Slice("box"));
  WriteBatchInternal::SetSequence(&batch, 200);
  Slice contents = WriteBatchInternal::Contents(&batch);
  WriteBatchInternal::SetContents(&batch,
                                  Slice(contents.data(), contents.size() - 1));
  ASSERT_EQ(
      "Put(foo, bar)@200"
      "ParseError()",
      PrintContents(&batch));
}